

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary,REF_DBL *bary)

{
  int iVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar9 = *orig_bary;
  if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
    if ((ulong)ABS(orig_bary[1]) < 0x7ff0000000000000) {
      if ((ulong)ABS(orig_bary[2]) < 0x7ff0000000000000) {
        if ((ulong)ABS(orig_bary[3]) < 0x7ff0000000000000) {
          dVar10 = 0.0;
          if (0.0 <= dVar9) {
            dVar10 = dVar9;
          }
          *bary = dVar10;
          dVar9 = 0.0;
          if (0.0 <= orig_bary[1]) {
            dVar9 = orig_bary[1];
          }
          bary[1] = dVar9;
          dVar8 = 0.0;
          if (0.0 <= orig_bary[2]) {
            dVar8 = orig_bary[2];
          }
          bary[2] = dVar8;
          dVar7 = 0.0;
          if (0.0 <= orig_bary[3]) {
            dVar7 = orig_bary[3];
          }
          bary[3] = dVar7;
          dVar6 = dVar10 + dVar9 + dVar8 + dVar7;
          dVar11 = dVar6 * 1e+20;
          if (dVar11 <= -dVar11) {
            dVar11 = -dVar11;
          }
          dVar12 = dVar10;
          if (dVar10 <= -dVar10) {
            dVar12 = -dVar10;
          }
          if (dVar12 < dVar11) {
            dVar12 = dVar9;
            if (dVar9 <= -dVar9) {
              dVar12 = -dVar9;
            }
            if (dVar12 < dVar11) {
              dVar12 = dVar8;
              if (dVar8 <= -dVar8) {
                dVar12 = -dVar8;
              }
              if (dVar12 < dVar11) {
                dVar12 = dVar7;
                if (dVar7 <= -dVar7) {
                  dVar12 = -dVar7;
                }
                if (dVar12 < dVar11) {
                  dVar10 = dVar10 / dVar6;
                  *bary = dVar10;
                  dVar9 = dVar9 / dVar6;
                  bary[1] = dVar9;
                  dVar8 = dVar8 / dVar6;
                  bary[2] = dVar8;
                  dVar7 = dVar7 / dVar6;
                  bary[3] = dVar7;
                  if (0.0 <= dVar10) {
                    if (0.0 <= dVar9) {
                      if (0.0 <= dVar8) {
                        if (0.0 <= dVar7) {
                          if ((long)ABS(dVar10) < 0x7ff0000000000000) {
                            if ((long)ABS(dVar9) < 0x7ff0000000000000) {
                              if ((long)ABS(dVar8) < 0x7ff0000000000000) {
                                if ((long)ABS(dVar7) < 0x7ff0000000000000) {
                                  return 0;
                                }
                                pcVar5 = "bary[3] not finite";
                                uVar4 = 0xbaf;
                              }
                              else {
                                pcVar5 = "bary[2] not finite";
                                uVar4 = 0xbae;
                              }
                            }
                            else {
                              pcVar5 = "bary[1] not finite";
                              uVar4 = 0xbad;
                            }
                          }
                          else {
                            pcVar5 = "bary[0] not finite";
                            uVar4 = 0xbac;
                          }
                        }
                        else {
                          pcVar5 = "bary[3] not positive";
                          uVar4 = 0xbaa;
                        }
                      }
                      else {
                        pcVar5 = "bary[2] not positive";
                        uVar4 = 0xba9;
                      }
                    }
                    else {
                      pcVar5 = "bary[1] not positive";
                      uVar4 = 0xba8;
                    }
                  }
                  else {
                    pcVar5 = "bary[0] not positive";
                    uVar4 = 0xba7;
                  }
                  goto LAB_0013a31f;
                }
              }
            }
          }
          printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",dVar6,*orig_bary
                 ,orig_bary[1],orig_bary[2],orig_bary[3],
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb98);
          printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          iVar3 = 0;
          lVar2 = 1;
          do {
            iVar1 = (int)lVar2;
            if (bary[lVar2] < bary[iVar3] || bary[lVar2] == bary[iVar3]) {
              iVar1 = iVar3;
            }
            iVar3 = iVar1;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          bary[2] = 0.0;
          bary[3] = 0.0;
          *bary = 0.0;
          bary[1] = 0.0;
          bary[iVar3] = 1.0;
          printf("modified bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          return 4;
        }
        pcVar5 = "orig_bary[3] not finite";
        uVar4 = 0xb84;
      }
      else {
        pcVar5 = "orig_bary[2] not finite";
        uVar4 = 0xb83;
      }
    }
    else {
      pcVar5 = "orig_bary[1] not finite";
      uVar4 = 0xb82;
    }
  }
  else {
    pcVar5 = "orig_bary[0] not finite";
    uVar4 = 0xb81;
  }
LAB_0013a31f:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_clip_bary4",pcVar5);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  RAS(isfinite(orig_bary[0]), "orig_bary[0] not finite");
  RAS(isfinite(orig_bary[1]), "orig_bary[1] not finite");
  RAS(isfinite(orig_bary[2]), "orig_bary[2] not finite");
  RAS(isfinite(orig_bary[3]), "orig_bary[3] not finite");

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);
  bary[2] = MAX(0.0, orig_bary[2]);
  bary[3] = MAX(0.0, orig_bary[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, orig_bary[0], orig_bary[1],
           orig_bary[2], orig_bary[3]);
    printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");
  RAS(bary[2] >= 0.0, "bary[2] not positive");
  RAS(bary[3] >= 0.0, "bary[3] not positive");

  RAS(isfinite(bary[0]), "bary[0] not finite");
  RAS(isfinite(bary[1]), "bary[1] not finite");
  RAS(isfinite(bary[2]), "bary[2] not finite");
  RAS(isfinite(bary[3]), "bary[3] not finite");

  return REF_SUCCESS;
}